

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_syslog.c
# Opt level: O1

int log_policy_stream_syslog_destroy(log_policy policy)

{
  log_policy_data __ptr;
  
  __ptr = log_policy_instance(policy);
  if (__ptr != (log_policy_data)0x0) {
    closelog();
    free(__ptr);
  }
  return 0;
}

Assistant:

static int log_policy_stream_syslog_destroy(log_policy policy)
{
	log_policy_stream_syslog_data syslog_data = log_policy_instance(policy);

	if (syslog_data != NULL)
	{
#if defined(_WIN32)
		if (syslog_data->handle != NULL)
		{
			DeregisterEventSource(syslog_data->handle);
		}
#elif defined(linux) || defined(__linux__) || defined(__linux) || defined(__gnu_linux) || \
	defined(__FreeBSD__) || \
	(defined(__APPLE__) && defined(__MACH__)) || defined(__MACOSX__)
		closelog();
#endif

		free(syslog_data);
	}

	return 0;
}